

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::SingleArena_NullDefault_Test::~SingleArena_NullDefault_Test
          (SingleArena_NullDefault_Test *this)

{
  SingleArena_NullDefault_Test *this_local;
  
  ~SingleArena_NullDefault_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_P(SingleArena, NullDefault) {
  auto arena = GetArena();

  ArenaStringPtr field;
  field.InitDefault();
  std::string* mut = field.Mutable(nonempty_default, arena.get());
  EXPECT_EQ(mut, field.Mutable(nonempty_default, arena.get()));
  EXPECT_EQ(mut, &field.Get());
  EXPECT_NE(nullptr, mut);
  EXPECT_EQ("default", *mut);
  *mut = "Test long long long long value";  // ensure string allocates storage
  EXPECT_EQ("Test long long long long value", field.Get());
  field.Destroy();
}